

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase252::run(TestCase252 *this)

{
  undefined1 auVar1 [16];
  uint uVar2;
  bool bVar3;
  Schema local_c8;
  Schema local_c0;
  DebugExpression<bool> _kjCondition_1;
  undefined1 auStack_b7 [11];
  undefined4 uStack_ac;
  DebugComparison<int,_unsigned_int> _kjCondition;
  short local_74;
  undefined4 local_70;
  DebugComparison<const_char_(&)[14],_capnp::Text::Reader> _kjCondition_5;
  
  stack0xffffffffffffff50 = (CapTableReader *)__kjCondition_1;
  __kjCondition_1 = (RawBrandedSchema *)(NULL_SCHEMA + 0x48);
  Schema::getProto((Reader *)&_kjCondition_5,(Schema *)&_kjCondition_1);
  _kjCondition.right = 0;
  if (0x6f < (uint)_kjCondition_5.op.content.size_) {
    _kjCondition.right = (uint)*(ushort *)(_kjCondition_5.right.super_StringPtr.content.size_ + 0xc)
    ;
  }
  _kjCondition.left = 0xff;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0xff;
  if ((_kjCondition.right != 0xff) && (kj::_::Debug::minSeverity < 3)) {
    local_c8.raw._0_4_ = 0xff;
    __kjCondition_1 = (RawBrandedSchema *)(NULL_SCHEMA + 0x48);
    Schema::getProto((Reader *)&_kjCondition_5,(Schema *)&_kjCondition_1);
    uVar2 = 0;
    if (0x6f < (uint)_kjCondition_5.op.content.size_) {
      uVar2 = (uint)*(ushort *)(_kjCondition_5.right.super_StringPtr.content.size_ + 0xc);
    }
    local_c0.raw._0_4_ = uVar2;
    kj::_::Debug::log<char_const(&)[63],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0xfd,ERROR,
               "\"failed: expected \" \"(0xff) == ((uint)Schema().getProto().which())\", _kjCondition, 0xff, (uint)Schema().getProto().which()"
               ,(char (*) [63])"failed: expected (0xff) == ((uint)Schema().getProto().which())",
               &_kjCondition,(int *)&local_c8,(uint *)&local_c0);
  }
  _kjCondition.left = 0x6d3d50;
  _kjCondition.right = 0;
  Schema::getProto((Reader *)&_kjCondition_5,(Schema *)&_kjCondition);
  if ((uint)_kjCondition_5.op.content.size_ < 0x70) {
    _kjCondition_1.value = false;
joined_r0x001b8c4f:
    if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[54],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xfe,ERROR,
                 "\"failed: expected \" \"StructSchema().getProto().isStruct()\", _kjCondition",
                 (char (*) [54])"failed: expected StructSchema().getProto().isStruct()",
                 &_kjCondition_1);
    }
  }
  else {
    _kjCondition_1.value = *(short *)(_kjCondition_5.right.super_StringPtr.content.size_ + 0xc) == 1
    ;
    if (!_kjCondition_1.value) goto joined_r0x001b8c4f;
  }
  _kjCondition.left = 0x6d3dc8;
  _kjCondition.right = 0;
  Schema::getProto((Reader *)&_kjCondition_5,(Schema *)&_kjCondition);
  if ((uint)_kjCondition_5.op.content.size_ < 0x70) {
    _kjCondition_1.value = false;
joined_r0x001b8cce:
    if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[50],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0xff,ERROR,
                 "\"failed: expected \" \"EnumSchema().getProto().isEnum()\", _kjCondition",
                 (char (*) [50])"failed: expected EnumSchema().getProto().isEnum()",&_kjCondition_1)
      ;
    }
  }
  else {
    _kjCondition_1.value = *(short *)(_kjCondition_5.right.super_StringPtr.content.size_ + 0xc) == 2
    ;
    if (!_kjCondition_1.value) goto joined_r0x001b8cce;
  }
  _kjCondition.left = 0x6d3e40;
  _kjCondition.right = 0;
  Schema::getProto((Reader *)&_kjCondition_5,(Schema *)&_kjCondition);
  if ((uint)_kjCondition_5.op.content.size_ < 0x70) {
    _kjCondition_1.value = false;
joined_r0x001b8d4d:
    if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[60],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x100,ERROR,
                 "\"failed: expected \" \"InterfaceSchema().getProto().isInterface()\", _kjCondition"
                 ,(char (*) [60])"failed: expected InterfaceSchema().getProto().isInterface()",
                 &_kjCondition_1);
    }
  }
  else {
    _kjCondition_1.value = *(short *)(_kjCondition_5.right.super_StringPtr.content.size_ + 0xc) == 3
    ;
    if (!_kjCondition_1.value) goto joined_r0x001b8d4d;
  }
  _kjCondition.left = 0x6d3eb8;
  _kjCondition.right = 0;
  Schema::getProto((Reader *)&_kjCondition_5,(Schema *)&_kjCondition);
  if ((uint)_kjCondition_5.op.content.size_ < 0x70) {
    auVar1[0xf] = 0;
    auVar1._0_15_ = _auStack_b7;
    __kjCondition_1 = (ArrayPtr<const_char>)(auVar1 << 8);
  }
  else {
    _kjCondition_1.value = *(short *)(_kjCondition_5.right.super_StringPtr.content.size_ + 0xc) == 4
    ;
    if (_kjCondition_1.value) goto LAB_001b8df7;
  }
  if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x101,ERROR,
               "\"failed: expected \" \"ConstSchema().getProto().isConst()\", _kjCondition",
               (char (*) [52])"failed: expected ConstSchema().getProto().isConst()",&_kjCondition_1)
    ;
  }
LAB_001b8df7:
  local_c8.raw = (RawBrandedSchema *)0x4e5f34;
  local_c0.raw = (RawBrandedSchema *)(NULL_SCHEMA + 0x48);
  Schema::getProto((Reader *)&_kjCondition,&local_c0);
  bVar3 = local_74 == 0;
  _kjCondition_5.right.super_StringPtr.content.size_ = _kjCondition._24_8_;
  if (bVar3) {
    _kjCondition_5.right.super_StringPtr.content.size_ = 0;
  }
  _kjCondition_5.op.content.ptr._0_4_ = 0x7fffffff;
  if (!bVar3) {
    _kjCondition_5.op.content.ptr._0_4_ = local_70;
  }
  _kjCondition_5.left._0_4_ = 0;
  _kjCondition_5.left._4_4_ = 0;
  _kjCondition_5.right.super_StringPtr.content.ptr._0_4_ = 0;
  _kjCondition_5.right.super_StringPtr.content.ptr._4_4_ = 0;
  if (!bVar3) {
    _kjCondition_5.left._0_4_ = _kjCondition.left;
    _kjCondition_5.left._4_4_ = _kjCondition.right;
    _kjCondition_5.right.super_StringPtr.content.ptr._0_4_ = _kjCondition.op.content.ptr._0_4_;
    _kjCondition_5.right.super_StringPtr.content.ptr._4_4_ = _kjCondition.op.content.ptr._4_4_;
  }
  __kjCondition_1 =
       (ArrayPtr<const_char>)
       PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_5,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[14]>::operator==
            (&_kjCondition_5,(DebugExpression<char_const(&)[14]> *)&local_c8,
             (Reader *)&_kjCondition_1);
  if ((_kjCondition_5.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_c8.raw = (RawBrandedSchema *)(NULL_SCHEMA + 0x48);
    Schema::getProto((Reader *)&_kjCondition,&local_c8);
    __kjCondition_1 = 0;
    auStack_b7._3_4_ = 0;
    auStack_b7._7_4_ = 0;
    uStack_ac = 0;
    if (local_74 != 0) {
      __kjCondition_1 = _kjCondition.left;
      auStack_b7._3_4_ = _kjCondition.right;
      auStack_b7._7_4_ = _kjCondition.op.content.ptr._0_4_;
      uStack_ac = _kjCondition.op.content.ptr._4_4_;
    }
    __kjCondition_1 =
         (ArrayPtr<const_char>)
         PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_1,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[77],kj::_::DebugComparison<char_const(&)[14],capnp::Text::Reader>&,char_const(&)[14],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x103,ERROR,
               "\"failed: expected \" \"(\\\"(null schema)\\\") == (Schema().getProto().getDisplayName())\", _kjCondition, \"(null schema)\", Schema().getProto().getDisplayName()"
               ,(char (*) [77])
                "failed: expected (\"(null schema)\") == (Schema().getProto().getDisplayName())",
               &_kjCondition_5,(char (*) [14])"(null schema)",(Reader *)&_kjCondition_1);
  }
  local_c8.raw = (RawBrandedSchema *)0x4e6028;
  local_c0.raw = (RawBrandedSchema *)(NULL_STRUCT_SCHEMA + 0x48);
  Schema::getProto((Reader *)&_kjCondition,&local_c0);
  bVar3 = local_74 == 0;
  _kjCondition_5.right.super_StringPtr.content.size_ = _kjCondition._24_8_;
  if (bVar3) {
    _kjCondition_5.right.super_StringPtr.content.size_ = 0;
  }
  _kjCondition_5.op.content.ptr._0_4_ = 0x7fffffff;
  if (!bVar3) {
    _kjCondition_5.op.content.ptr._0_4_ = local_70;
  }
  _kjCondition_5.left._0_4_ = 0;
  _kjCondition_5.left._4_4_ = 0;
  _kjCondition_5.right.super_StringPtr.content.ptr._0_4_ = 0;
  _kjCondition_5.right.super_StringPtr.content.ptr._4_4_ = 0;
  if (!bVar3) {
    _kjCondition_5.left._0_4_ = _kjCondition.left;
    _kjCondition_5.left._4_4_ = _kjCondition.right;
    _kjCondition_5.right.super_StringPtr.content.ptr._0_4_ = _kjCondition.op.content.ptr._0_4_;
    _kjCondition_5.right.super_StringPtr.content.ptr._4_4_ = _kjCondition.op.content.ptr._4_4_;
  }
  __kjCondition_1 =
       (ArrayPtr<const_char>)
       PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_5,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[21]>::operator==
            ((DebugComparison<const_char_(&)[21],_capnp::Text::Reader> *)&_kjCondition_5,
             (DebugExpression<char_const(&)[21]> *)&local_c8,(Reader *)&_kjCondition_1);
  if ((_kjCondition_5.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_c8.raw = (RawBrandedSchema *)(NULL_STRUCT_SCHEMA + 0x48);
    Schema::getProto((Reader *)&_kjCondition,&local_c8);
    __kjCondition_1 = 0;
    auStack_b7._3_4_ = 0;
    auStack_b7._7_4_ = 0;
    uStack_ac = 0;
    if (local_74 != 0) {
      __kjCondition_1 = _kjCondition.left;
      auStack_b7._3_4_ = _kjCondition.right;
      auStack_b7._7_4_ = _kjCondition.op.content.ptr._0_4_;
      uStack_ac = _kjCondition.op.content.ptr._4_4_;
    }
    __kjCondition_1 =
         (ArrayPtr<const_char>)
         PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_1,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[90],kj::_::DebugComparison<char_const(&)[21],capnp::Text::Reader>&,char_const(&)[21],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x104,ERROR,
               "\"failed: expected \" \"(\\\"(null struct schema)\\\") == (StructSchema().getProto().getDisplayName())\", _kjCondition, \"(null struct schema)\", StructSchema().getProto().getDisplayName()"
               ,(char (*) [90])
                "failed: expected (\"(null struct schema)\") == (StructSchema().getProto().getDisplayName())"
               ,(DebugComparison<const_char_(&)[21],_capnp::Text::Reader> *)&_kjCondition_5,
               (char (*) [21])"(null struct schema)",(Reader *)&_kjCondition_1);
  }
  local_c8.raw = (RawBrandedSchema *)0x4e614a;
  local_c0.raw = (RawBrandedSchema *)(NULL_ENUM_SCHEMA + 0x48);
  Schema::getProto((Reader *)&_kjCondition,&local_c0);
  bVar3 = local_74 == 0;
  _kjCondition_5.right.super_StringPtr.content.size_ = _kjCondition._24_8_;
  if (bVar3) {
    _kjCondition_5.right.super_StringPtr.content.size_ = 0;
  }
  _kjCondition_5.op.content.ptr._0_4_ = 0x7fffffff;
  if (!bVar3) {
    _kjCondition_5.op.content.ptr._0_4_ = local_70;
  }
  _kjCondition_5.left._0_4_ = 0;
  _kjCondition_5.left._4_4_ = 0;
  _kjCondition_5.right.super_StringPtr.content.ptr._0_4_ = 0;
  _kjCondition_5.right.super_StringPtr.content.ptr._4_4_ = 0;
  if (!bVar3) {
    _kjCondition_5.left._0_4_ = _kjCondition.left;
    _kjCondition_5.left._4_4_ = _kjCondition.right;
    _kjCondition_5.right.super_StringPtr.content.ptr._0_4_ = _kjCondition.op.content.ptr._0_4_;
    _kjCondition_5.right.super_StringPtr.content.ptr._4_4_ = _kjCondition.op.content.ptr._4_4_;
  }
  __kjCondition_1 =
       (ArrayPtr<const_char>)
       PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_5,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[19]>::operator==
            ((DebugComparison<const_char_(&)[19],_capnp::Text::Reader> *)&_kjCondition_5,
             (DebugExpression<char_const(&)[19]> *)&local_c8,(Reader *)&_kjCondition_1);
  if ((_kjCondition_5.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_c8.raw = (RawBrandedSchema *)(NULL_ENUM_SCHEMA + 0x48);
    Schema::getProto((Reader *)&_kjCondition,&local_c8);
    __kjCondition_1 = 0;
    auStack_b7._3_4_ = 0;
    auStack_b7._7_4_ = 0;
    uStack_ac = 0;
    if (local_74 != 0) {
      __kjCondition_1 = _kjCondition.left;
      auStack_b7._3_4_ = _kjCondition.right;
      auStack_b7._7_4_ = _kjCondition.op.content.ptr._0_4_;
      uStack_ac = _kjCondition.op.content.ptr._4_4_;
    }
    __kjCondition_1 =
         (ArrayPtr<const_char>)
         PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_1,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[86],kj::_::DebugComparison<char_const(&)[19],capnp::Text::Reader>&,char_const(&)[19],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x105,ERROR,
               "\"failed: expected \" \"(\\\"(null enum schema)\\\") == (EnumSchema().getProto().getDisplayName())\", _kjCondition, \"(null enum schema)\", EnumSchema().getProto().getDisplayName()"
               ,(char (*) [86])
                "failed: expected (\"(null enum schema)\") == (EnumSchema().getProto().getDisplayName())"
               ,(DebugComparison<const_char_(&)[19],_capnp::Text::Reader> *)&_kjCondition_5,
               (char (*) [19])"(null enum schema)",(Reader *)&_kjCondition_1);
  }
  local_c8.raw = (RawBrandedSchema *)0x4e625e;
  local_c0.raw = (RawBrandedSchema *)(NULL_INTERFACE_SCHEMA + 0x48);
  Schema::getProto((Reader *)&_kjCondition,&local_c0);
  bVar3 = local_74 == 0;
  _kjCondition_5.right.super_StringPtr.content.size_ = _kjCondition._24_8_;
  if (bVar3) {
    _kjCondition_5.right.super_StringPtr.content.size_ = 0;
  }
  _kjCondition_5.op.content.ptr._0_4_ = 0x7fffffff;
  if (!bVar3) {
    _kjCondition_5.op.content.ptr._0_4_ = local_70;
  }
  _kjCondition_5.left._0_4_ = 0;
  _kjCondition_5.left._4_4_ = 0;
  _kjCondition_5.right.super_StringPtr.content.ptr._0_4_ = 0;
  _kjCondition_5.right.super_StringPtr.content.ptr._4_4_ = 0;
  if (!bVar3) {
    _kjCondition_5.left._0_4_ = _kjCondition.left;
    _kjCondition_5.left._4_4_ = _kjCondition.right;
    _kjCondition_5.right.super_StringPtr.content.ptr._0_4_ = _kjCondition.op.content.ptr._0_4_;
    _kjCondition_5.right.super_StringPtr.content.ptr._4_4_ = _kjCondition.op.content.ptr._4_4_;
  }
  __kjCondition_1 =
       (ArrayPtr<const_char>)
       PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_5,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[24]>::operator==
            ((DebugComparison<const_char_(&)[24],_capnp::Text::Reader> *)&_kjCondition_5,
             (DebugExpression<char_const(&)[24]> *)&local_c8,(Reader *)&_kjCondition_1);
  if ((_kjCondition_5.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_c8.raw = (RawBrandedSchema *)(NULL_INTERFACE_SCHEMA + 0x48);
    Schema::getProto((Reader *)&_kjCondition,&local_c8);
    __kjCondition_1 = 0;
    auStack_b7._3_4_ = 0;
    auStack_b7._7_4_ = 0;
    uStack_ac = 0;
    if (local_74 != 0) {
      __kjCondition_1 = _kjCondition.left;
      auStack_b7._3_4_ = _kjCondition.right;
      auStack_b7._7_4_ = _kjCondition.op.content.ptr._0_4_;
      uStack_ac = _kjCondition.op.content.ptr._4_4_;
    }
    __kjCondition_1 =
         (ArrayPtr<const_char>)
         PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_1,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[96],kj::_::DebugComparison<char_const(&)[24],capnp::Text::Reader>&,char_const(&)[24],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x106,ERROR,
               "\"failed: expected \" \"(\\\"(null interface schema)\\\") == (InterfaceSchema().getProto().getDisplayName())\", _kjCondition, \"(null interface schema)\", InterfaceSchema().getProto().getDisplayName()"
               ,(char (*) [96])
                "failed: expected (\"(null interface schema)\") == (InterfaceSchema().getProto().getDisplayName())"
               ,(DebugComparison<const_char_(&)[24],_capnp::Text::Reader> *)&_kjCondition_5,
               (char (*) [24])"(null interface schema)",(Reader *)&_kjCondition_1);
  }
  local_c8.raw = (RawBrandedSchema *)0x4e6395;
  local_c0.raw = (RawBrandedSchema *)(NULL_CONST_SCHEMA + 0x48);
  Schema::getProto((Reader *)&_kjCondition,&local_c0);
  bVar3 = local_74 == 0;
  _kjCondition_5.right.super_StringPtr.content.size_ = _kjCondition._24_8_;
  if (bVar3) {
    _kjCondition_5.right.super_StringPtr.content.size_ = 0;
  }
  _kjCondition_5.op.content.ptr._0_4_ = 0x7fffffff;
  if (!bVar3) {
    _kjCondition_5.op.content.ptr._0_4_ = local_70;
  }
  _kjCondition_5.left._0_4_ = 0;
  _kjCondition_5.left._4_4_ = 0;
  _kjCondition_5.right.super_StringPtr.content.ptr._0_4_ = 0;
  _kjCondition_5.right.super_StringPtr.content.ptr._4_4_ = 0;
  if (!bVar3) {
    _kjCondition_5.left._0_4_ = _kjCondition.left;
    _kjCondition_5.left._4_4_ = _kjCondition.right;
    _kjCondition_5.right.super_StringPtr.content.ptr._0_4_ = _kjCondition.op.content.ptr._0_4_;
    _kjCondition_5.right.super_StringPtr.content.ptr._4_4_ = _kjCondition.op.content.ptr._4_4_;
  }
  __kjCondition_1 =
       (ArrayPtr<const_char>)
       PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_5,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[20]>::operator==
            ((DebugComparison<const_char_(&)[20],_capnp::Text::Reader> *)&_kjCondition_5,
             (DebugExpression<char_const(&)[20]> *)&local_c8,(Reader *)&_kjCondition_1);
  if ((_kjCondition_5.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_c8.raw = (RawBrandedSchema *)(NULL_CONST_SCHEMA + 0x48);
    Schema::getProto((Reader *)&_kjCondition,&local_c8);
    __kjCondition_1 = 0;
    auStack_b7._3_4_ = 0;
    auStack_b7._7_4_ = 0;
    uStack_ac = 0;
    if (local_74 != 0) {
      __kjCondition_1 = _kjCondition.left;
      auStack_b7._3_4_ = _kjCondition.right;
      auStack_b7._7_4_ = _kjCondition.op.content.ptr._0_4_;
      uStack_ac = _kjCondition.op.content.ptr._4_4_;
    }
    __kjCondition_1 =
         (ArrayPtr<const_char>)
         PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjCondition_1,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[88],kj::_::DebugComparison<char_const(&)[20],capnp::Text::Reader>&,char_const(&)[20],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x107,ERROR,
               "\"failed: expected \" \"(\\\"(null const schema)\\\") == (ConstSchema().getProto().getDisplayName())\", _kjCondition, \"(null const schema)\", ConstSchema().getProto().getDisplayName()"
               ,(char (*) [88])
                "failed: expected (\"(null const schema)\") == (ConstSchema().getProto().getDisplayName())"
               ,(DebugComparison<const_char_(&)[20],_capnp::Text::Reader> *)&_kjCondition_5,
               (char (*) [20])"(null const schema)",(Reader *)&_kjCondition_1);
  }
  __kjCondition_1 = (RawBrandedSchema *)(NULL_INTERFACE_SCHEMA + 0x48);
  Schema::getProto((Reader *)&_kjCondition_5,(Schema *)&_kjCondition_1);
  if ((uint)_kjCondition_5.op.content.size_ < 0x40) {
    _kjCondition._0_8_ = 0;
  }
  else {
    _kjCondition._0_8_ = *(undefined8 *)_kjCondition_5.right.super_StringPtr.content.size_;
  }
  _kjCondition.op.content.ptr = (char *)0x3;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_3c21f;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if ((_kjCondition._0_8_ != 3) && (kj::_::Debug::minSeverity < 3)) {
    local_c8.raw = (RawBrandedSchema *)(NULL_INTERFACE_SCHEMA + 0x48);
    Schema::getProto((Reader *)&_kjCondition_5,&local_c8);
    if ((uint)_kjCondition_5.op.content.size_ < 0x40) {
      __kjCondition_1 = (RawBrandedSchema *)0x0;
    }
    else {
      __kjCondition_1 = *(RawBrandedSchema **)_kjCondition_5.right.super_StringPtr.content.size_;
    }
    local_c0.raw = (RawBrandedSchema *)0x3;
    kj::_::Debug::
    log<char_const(&)[82],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x10a,ERROR,
               "\"failed: expected \" \"(InterfaceSchema().getProto().getId()) == (typeId<Capability>())\", _kjCondition, InterfaceSchema().getProto().getId(), typeId<Capability>()"
               ,(char (*) [82])
                "failed: expected (InterfaceSchema().getProto().getId()) == (typeId<Capability>())",
               (DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition,
               (unsigned_long *)&_kjCondition_1,(unsigned_long *)&local_c0);
  }
  return;
}

Assistant:

TEST(Schema, FieldLookupOutOfOrder) {
  // Tests that name lookup works correctly when the fields are defined out-of-order in the schema
  // file.
  auto schema = Schema::from<test::TestOutOfOrder>().asStruct();

  EXPECT_EQ("qux", schema.getFields()[0].getProto().getName());
  EXPECT_EQ("grault", schema.getFields()[1].getProto().getName());
  EXPECT_EQ("bar", schema.getFields()[2].getProto().getName());
  EXPECT_EQ("foo", schema.getFields()[3].getProto().getName());
  EXPECT_EQ("corge", schema.getFields()[4].getProto().getName());
  EXPECT_EQ("waldo", schema.getFields()[5].getProto().getName());
  EXPECT_EQ("quux", schema.getFields()[6].getProto().getName());
  EXPECT_EQ("garply", schema.getFields()[7].getProto().getName());
  EXPECT_EQ("baz", schema.getFields()[8].getProto().getName());

  EXPECT_EQ(3, schema.getFieldByName("foo").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(2, schema.getFieldByName("bar").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(8, schema.getFieldByName("baz").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(0, schema.getFieldByName("qux").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(6, schema.getFieldByName("quux").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(4, schema.getFieldByName("corge").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(1, schema.getFieldByName("grault").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(7, schema.getFieldByName("garply").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(5, schema.getFieldByName("waldo").getProto().getOrdinal().getExplicit());
}